

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::handleSignal(int sig)

{
  SignalDefs *def;
  SignalDefs *__end1;
  SignalDefs *__begin1;
  SignalDefs (*__range1) [6];
  char *name;
  int sig_local;
  
  __range1 = (SignalDefs (*) [6])anon_var_dwarf_9531c;
  __end1 = (SignalDefs *)&signalDefs;
  do {
    if (__end1 == (SignalDefs *)&trim::whitespaceChars) {
LAB_00124066:
      restorePreviousSignalHandlers();
      anon_unknown.dwarf_9521b::reportFatal((char *)__range1);
      raise(sig);
      return;
    }
    if (sig == __end1->id) {
      __range1 = (SignalDefs (*) [6])__end1->name;
      goto LAB_00124066;
    }
    __end1 = __end1 + 1;
  } while( true );
}

Assistant:

static void handleSignal( int sig ) {
        char const * name = "<unknown signal>";
        for (auto const& def : signalDefs) {
            if (sig == def.id) {
                name = def.name;
                break;
            }
        }
        // We need to restore previous signal handlers and let them do
        // their thing, so that the users can have the debugger break
        // when a signal is raised, and so on.
        restorePreviousSignalHandlers();
        reportFatal( name );
        raise( sig );
    }